

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::finish(DefaultThreadPoolProvider *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  DefaultThreadPoolProvider *in_stack_fffffffffffffff0;
  
  std::
  __shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108e3b);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  lockedFinish(in_stack_fffffffffffffff0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x108e61);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::finish ()
{
    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    lockedFinish ();
}